

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complex.cpp
# Opt level: O0

Complex * __thiscall Complex::inverse(Complex *this)

{
  undefined1 uVar1;
  char *pcVar2;
  Rational *in_RSI;
  Complex *in_RDI;
  Rational sqmod;
  undefined7 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe47;
  Complex *in_stack_fffffffffffffe60;
  Rational *in_stack_fffffffffffffe68;
  Rational *in_stack_fffffffffffffe88;
  
  ::operator*(in_stack_fffffffffffffe68,&in_stack_fffffffffffffe60->_re);
  ::operator*(in_stack_fffffffffffffe68,&in_stack_fffffffffffffe60->_re);
  ::operator+(in_stack_fffffffffffffe68,&in_stack_fffffffffffffe60->_re);
  Rational::~Rational((Rational *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
  Rational::~Rational((Rational *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
  uVar1 = Rational::operator_cast_to_bool((Rational *)0x183a82);
  if (!(bool)uVar1) {
    pcVar2 = (char *)__cxa_allocate_exception(0x10);
    zero_division_error::runtime_error
              ((zero_division_error *)CONCAT17(uVar1,in_stack_fffffffffffffe40),pcVar2);
    __cxa_throw(pcVar2,&zero_division_error::typeinfo,zero_division_error::~zero_division_error);
  }
  operator/(in_stack_fffffffffffffe68,&in_stack_fffffffffffffe60->_re);
  Rational::operator-(in_stack_fffffffffffffe88);
  operator/(in_stack_fffffffffffffe68,&in_stack_fffffffffffffe60->_re);
  Complex(in_stack_fffffffffffffe60,in_RSI,&in_RDI->_re);
  Rational::~Rational((Rational *)CONCAT17(uVar1,in_stack_fffffffffffffe40));
  Rational::~Rational((Rational *)CONCAT17(uVar1,in_stack_fffffffffffffe40));
  Rational::~Rational((Rational *)CONCAT17(uVar1,in_stack_fffffffffffffe40));
  Rational::~Rational((Rational *)CONCAT17(uVar1,in_stack_fffffffffffffe40));
  return in_RDI;
}

Assistant:

const Complex Complex::inverse() const
{
    Rational sqmod = _re * _re + _im * _im;
    if(!sqmod)
        throw zero_division_error("Complex division by zero");
    return Complex(_re / sqmod, -_im / sqmod);
}